

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O1

void __thiscall QtMWidgets::Stepper::stepBy(Stepper *this,int step)

{
  int iVar1;
  int iVar2;
  StepperPrivate *this_00;
  int iVar3;
  
  this_00 = (this->d).d;
  iVar1 = this_00->minimum;
  iVar2 = this_00->value;
  iVar3 = step * this_00->singleStep + iVar2;
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
    if (this_00->wrapping != false) {
      iVar3 = this_00->maximum;
    }
  }
  else if ((this_00->maximum < iVar3) && (iVar3 = this_00->maximum, this_00->wrapping != false)) {
    iVar3 = iVar1;
  }
  this_00->value = iVar3;
  StepperPrivate::enableButtons(this_00);
  iVar1 = ((this->d).d)->value;
  if (iVar2 != iVar1) {
    valueChanged(this,iVar1);
    return;
  }
  return;
}

Assistant:

void
Stepper::stepBy( int step )
{
	const int old = d->value;

	d->value = d->bound( step * d->singleStep + d->value );

	d->enableButtons();

	if( old != d->value )
		emit valueChanged( d->value );
}